

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O0

void load_from_mem_sse2(sljit_compiler *compiler,sljit_s32 dst_xmm_reg,sljit_s32 src_general_reg)

{
  undefined1 local_1d;
  undefined1 local_1c;
  undefined1 local_1b;
  byte local_1a;
  byte local_19;
  sljit_s32 sStack_18;
  sljit_u8 instruction [5];
  sljit_s32 src_general_reg_local;
  sljit_s32 dst_xmm_reg_local;
  sljit_compiler *compiler_local;
  
  sStack_18 = src_general_reg;
  instruction._1_4_ = dst_xmm_reg;
  if (src_general_reg < 8) {
    local_1d = 0x66;
    local_1c = 0xf;
    local_1b = 0x6f;
    local_1a = (byte)(dst_xmm_reg << 3) | (byte)src_general_reg;
    sljit_emit_op_custom(compiler,&local_1d,4);
  }
  else {
    local_1d = 0x66;
    local_1c = 0x41;
    local_1b = 0xf;
    local_1a = 0x6f;
    local_19 = (byte)(dst_xmm_reg << 3) | (byte)src_general_reg & 7;
    sljit_emit_op_custom(compiler,&local_1d,4);
  }
  return;
}

Assistant:

static void load_from_mem_sse2(struct sljit_compiler *compiler, sljit_s32 dst_xmm_reg, sljit_s32 src_general_reg)
{
#if (defined SLJIT_CONFIG_X86_64 && SLJIT_CONFIG_X86_64)
sljit_u8 instruction[5];
#else
sljit_u8 instruction[4];
#endif

SLJIT_ASSERT(dst_xmm_reg < 8);

/* MOVDQA xmm1, xmm2/m128 */
#if (defined SLJIT_CONFIG_X86_64 && SLJIT_CONFIG_X86_64)
if (src_general_reg < 8)
  {
  instruction[0] = 0x66;
  instruction[1] = 0x0f;
  instruction[2] = 0x6f;
  instruction[3] = (dst_xmm_reg << 3) | src_general_reg;
  sljit_emit_op_custom(compiler, instruction, 4);
  }
else
  {
  instruction[0] = 0x66;
  instruction[1] = 0x41;
  instruction[2] = 0x0f;
  instruction[3] = 0x6f;
  instruction[4] = (dst_xmm_reg << 3) | (src_general_reg & 0x7);
  sljit_emit_op_custom(compiler, instruction, 4);
  }
#else
instruction[0] = 0x66;
instruction[1] = 0x0f;
instruction[2] = 0x6f;
instruction[3] = (dst_xmm_reg << 3) | src_general_reg;
sljit_emit_op_custom(compiler, instruction, 4);
#endif
}